

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall
SVGChart::PPlot::DrawYTick
          (PPlot *this,float inY,int inScreenX,bool inMajor,string *inFormatString,
          Painter *inPainter,PRect *outRect)

{
  undefined1 auVar1 [16];
  int iVar2;
  int extraout_var;
  undefined7 in_register_00000011;
  int iVar3;
  float extraout_XMM0_Da;
  char theBuf [128];
  
  (*this->mYTrafo->_vptr_Trafo[2])();
  outRect->mX = (long)inScreenX;
  outRect->mY = (long)extraout_XMM0_Da;
  outRect->mW = 0;
  outRect->mH = 0;
  if ((int)CONCAT71(in_register_00000011,inMajor) == 0) {
    iVar3 = (this->mYAxisSetup).mTickInfo.mMinorTickScreenSize;
    outRect->mX = (long)inScreenX - (long)iVar3;
  }
  else {
    iVar3 = (this->mYAxisSetup).mTickInfo.mMajorTickScreenSize;
    snprintf(theBuf,0x80,(inFormatString->_M_dataplus)._M_p,SUB84((double)inY,0));
    iVar2 = (*inPainter->_vptr_Painter[8])(inPainter,theBuf);
    outRect->mX = outRect->mX -
                  ((long)(iVar2 + iVar3) + (long)(this->mYAxisSetup).mTickInfo.mMinorTickScreenSize)
    ;
    iVar2 = (*inPainter->_vptr_Painter[9])(inPainter);
    auVar1._4_4_ = extraout_var;
    auVar1._0_4_ = iVar2;
    auVar1._8_8_ = (long)extraout_var >> 0x1f;
    (*inPainter->_vptr_Painter[10])
              (inPainter,(ulong)(uint)outRect->mX,
               (ulong)(uint)(int)(extraout_XMM0_Da + (float)SUB164(auVar1 / SEXT816(2),0)),theBuf);
  }
  (**inPainter->_vptr_Painter)
            ((float)inScreenX,extraout_XMM0_Da,(float)(inScreenX - iVar3),extraout_XMM0_Da,inPainter
            );
  return true;
}

Assistant:

bool PPlot::DrawYTick (float inY, int inScreenX, bool inMajor, const string &inFormatString, Painter &inPainter, PRect &outRect) const {
      char theBuf[128];
      int theTickSize;
      float theScreenY = mYTrafo->Transform(inY);
      outRect.mX = inScreenX;
      outRect.mY = theScreenY;
      outRect.mW = 0;// not used
      outRect.mH = 0;// not used
      if (inMajor) {
        theTickSize = mYAxisSetup.mTickInfo.mMajorTickScreenSize;
        snprintf (theBuf, 128, inFormatString.c_str (), inY);
        int theStringWidth = inPainter.CalculateTextDrawSize (theBuf);
        outRect.mX -= (theStringWidth+theTickSize+mYAxisSetup.mTickInfo.mMinorTickScreenSize);
        int theHalfFontHeight = inPainter.GetFontHeight ()/2;// for sort of vertical centralizing
        inPainter.DrawText (outRect.mX, theScreenY+theHalfFontHeight, theBuf);

      }
      else {
        theTickSize = mYAxisSetup.mTickInfo.mMinorTickScreenSize;
        outRect.mX -= theTickSize;
      }

      inPainter.DrawLine (inScreenX, theScreenY, inScreenX-theTickSize, theScreenY);
      return true;
    }